

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O3

float dt(qnode_ptr_t c,qnode_ptr_t q,int x,int y)

{
  uint uVar1;
  long lVar2;
  float fVar3;
  
  fVar3 = 0.0;
  if (-2 < C.m) {
    uVar1 = C.m / 2;
    lVar2 = 0;
    do {
      fVar3 = fVar3 + *(float *)(*(long *)((long)c +
                                          lVar2 * 8 +
                                          (ulong)uVar1 * 8 + (long)(int)uVar1 * -8 + 0x18) +
                                (long)(x * c->res + y) * 4) *
                      *(float *)((long)&C + (ulong)uVar1 * 4 + (long)(int)uVar1 * -4 + lVar2 * 4);
      lVar2 = lVar2 + 1;
    } while ((C.m - (C.m >> 0x1f) | 1U) != (uint)lVar2);
  }
  return fVar3 / C.f;
}

Assistant:

float dt(c,q,x,y)
qnode_ptr_t c, q ;
int x, y ;

{ extern kernel_t C ;
  float d ;
  int i, k, h ;

  h = C.m/2 ;
  k = c->sizz/2 ;

  d = 0.0 ;
 for (i = -h ; i <= h ; i++) {
    d += (*c->gauss_ptr[i+h])[c->res*x + y]*C.k[i+h] ;
  }
  d /= C.f ;
  return(d) ;
}